

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O2

bool soul::ASTUtilities::exposeChildEndpoints(Allocator *allocator,Graph *graph)

{
  pointer ppVar1;
  UTF8Reader UVar2;
  bool bVar3;
  int iVar4;
  pool_ref<soul::AST::EndpointDeclaration> *childEndpoint;
  Expression *pEVar5;
  Graph *graph_00;
  ProcessorBase *pPVar6;
  undefined4 extraout_var;
  EndpointDetails *pEVar8;
  EndpointDeclaration *pEVar9;
  Identifier IVar10;
  SharedEndpoint *args_3;
  SharedEndpoint *args_2;
  Scope SVar11;
  long *plVar12;
  _func_int **extraout_RDX;
  long *extraout_RDX_00;
  pointer ppVar13;
  pool_ref<soul::AST::ProcessorInstance> *i;
  bool bVar14;
  Type *t;
  Ptr type;
  pool_ref<soul::AST::ProcessorInstance> *i_1;
  pool_ptr<soul::AST::ProcessorBase> childProcessor;
  pool_ptr<soul::AST::Graph> childGraph;
  pool_ptr<soul::AST::EndpointDeclaration> parentEndpoint;
  Context local_b8;
  pool_ptr<soul::AST::ProcessorBase> local_a0;
  Graph *local_98;
  pool_ref<soul::AST::Connection> local_90;
  InterpolationType local_84;
  pointer local_80;
  undefined1 local_78 [16];
  Ptr local_68;
  UTF8Reader local_60;
  vector<soul::pool_ref<soul::AST::Connection>,std::allocator<soul::pool_ref<soul::AST::Connection>>>
  *local_58;
  Scope local_50;
  Ptr local_48;
  UTF8Reader local_40;
  Identifier local_38;
  _func_int **pp_Var7;
  undefined4 extraout_var_00;
  
  ppVar1 = (graph->processorInstances).
           super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar14 = false;
  local_98 = graph;
  for (ppVar13 = (graph->processorInstances).
                 super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar13 != ppVar1; ppVar13 = ppVar13 + 1
      ) {
    pEVar5 = pool_ptr<soul::AST::Expression>::operator->(&ppVar13->object->targetProcessor);
    (*(pEVar5->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_b8,pEVar5);
    if (local_b8.location.sourceCode.object != (SourceCodeText *)0x0) {
      local_38.name = (string *)local_b8.location.sourceCode.object;
      cast<soul::AST::Graph,soul::AST::ProcessorBase>
                ((soul *)&local_a0,(pool_ptr<soul::AST::ProcessorBase> *)&local_38);
      if (local_a0.object != (ProcessorBase *)0x0) {
        graph_00 = pool_ptr<soul::AST::Graph>::operator*((pool_ptr<soul::AST::Graph> *)&local_a0);
        bVar3 = exposeChildEndpoints(allocator,graph_00);
        bVar14 = (bool)(bVar14 | bVar3);
      }
    }
  }
  local_78._8_8_ =
       (local_98->processorInstances).
       super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_60.data = (char *)&allocator->identifiers;
  local_68.object = (SourceCodeText *)&(local_98->super_ProcessorBase).endpoints;
  local_58 = (vector<soul::pool_ref<soul::AST::Connection>,std::allocator<soul::pool_ref<soul::AST::Connection>>>
              *)&local_98->connections;
  for (ppVar13 = (local_98->processorInstances).
                 super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar13 != (pointer)local_78._8_8_;
      ppVar13 = ppVar13 + 1) {
    pEVar5 = pool_ptr<soul::AST::Expression>::operator->(&ppVar13->object->targetProcessor);
    (*(pEVar5->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_a0,pEVar5);
    if (local_a0.object != (ProcessorBase *)0x0) {
      local_80 = ppVar13;
      pPVar6 = pool_ptr<soul::AST::ProcessorBase>::operator->(&local_a0);
      iVar4 = (*(pPVar6->super_ModuleBase).super_ASTObject._vptr_ASTObject[8])(pPVar6);
      SVar11._vptr_Scope = extraout_RDX;
      local_50._vptr_Scope = extraout_RDX;
      for (pp_Var7 = (_func_int **)CONCAT44(extraout_var,iVar4); ppVar13 = local_80,
          pp_Var7 != SVar11._vptr_Scope; pp_Var7 = pp_Var7 + 1) {
        if ((*pp_Var7)[0x60] == (_func_int)0x1) {
          AST::ProcessorBase::findEndpoint<soul::Identifier>
                    ((ProcessorBase *)local_78,(Identifier *)local_98,(bool)((char)*pp_Var7 + '0'));
          if ((EndpointDeclaration *)local_78._0_8_ == (EndpointDeclaration *)0x0) {
            local_b8.location.sourceCode.object = (SourceCodeText *)0x0;
            local_b8.location.location.data = (char *)0x0;
            local_b8.parentScope = (Scope *)0x0;
            local_90.object = local_90.object & 0xffffffffffffff00;
            local_78._0_8_ =
                 PoolAllocator::allocate<soul::AST::EndpointDeclaration,soul::AST::Context,bool>
                           (&allocator->pool,&local_b8,(bool *)&local_90);
            RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                      ((RefCountedPtr<soul::SourceCodeText> *)&local_b8);
            IVar10 = Identifier::Pool::get((Pool *)local_60.data,(Identifier *)(*pp_Var7 + 0x30));
            pEVar9 = pool_ptr<soul::AST::EndpointDeclaration>::operator->
                               ((pool_ptr<soul::AST::EndpointDeclaration> *)local_78);
            (pEVar9->name).name = IVar10.name;
            pEVar8 = pool_ptr<soul::AST::EndpointDetails>::operator*
                               ((pool_ptr<soul::AST::EndpointDetails> *)(*pp_Var7 + 0x38));
            pEVar8 = PoolAllocator::allocate<soul::AST::EndpointDetails,soul::AST::EndpointDetails&>
                               (&allocator->pool,pEVar8);
            pEVar9 = pool_ptr<soul::AST::EndpointDeclaration>::operator->
                               ((pool_ptr<soul::AST::EndpointDeclaration> *)local_78);
            (pEVar9->details).object = pEVar8;
            pEVar9 = pool_ptr<soul::AST::EndpointDeclaration>::operator->
                               ((pool_ptr<soul::AST::EndpointDeclaration> *)local_78);
            pEVar9->needsToBeExposedInParent = true;
            local_b8.location.sourceCode.object =
                 (SourceCodeText *)
                 pool_ptr<soul::AST::EndpointDeclaration>::operator*
                           ((pool_ptr<soul::AST::EndpointDeclaration> *)local_78);
            std::
            vector<soul::pool_ref<soul::AST::EndpointDeclaration>,std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>>>
            ::emplace_back<soul::pool_ref<soul::AST::EndpointDeclaration>>
                      ((vector<soul::pool_ref<soul::AST::EndpointDeclaration>,std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>>>
                        *)local_68.object,(pool_ref<soul::AST::EndpointDeclaration> *)&local_b8);
          }
          else {
            pEVar8 = pool_ptr<soul::AST::EndpointDetails>::operator*
                               ((pool_ptr<soul::AST::EndpointDetails> *)(*pp_Var7 + 0x38));
            AST::EndpointDetails::getResolvedDataTypes
                      ((vector<soul::Type,_std::allocator<soul::Type>_> *)&local_b8,pEVar8);
            UVar2.data = local_b8.location.location.data;
            for (type.object = local_b8.location.sourceCode.object;
                type.object != (SourceCodeText *)UVar2.data;
                type.object = (SourceCodeText *)&((type.object)->filename).field_2) {
              pEVar9 = pool_ptr<soul::AST::EndpointDeclaration>::operator*
                                 ((pool_ptr<soul::AST::EndpointDeclaration> *)local_78);
              ensureEventEndpointSupportsType(allocator,pEVar9,(Type *)type.object);
            }
            std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector
                      ((vector<soul::Type,_std::allocator<soul::Type>_> *)&local_b8);
          }
          local_b8.location.sourceCode.object = (SourceCodeText *)0x0;
          local_b8.location.location.data = (char *)0x0;
          local_b8.parentScope = (Scope *)0x0;
          pEVar9 = pool_ptr<soul::AST::EndpointDeclaration>::operator*
                             ((pool_ptr<soul::AST::EndpointDeclaration> *)local_78);
          pEVar5 = createEndpointRef(allocator,&local_b8,pEVar9);
          args_3 = PoolAllocator::
                   allocate<soul::AST::Connection::SharedEndpoint,soul::AST::Expression&>
                             (&allocator->pool,pEVar5);
          RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                    ((RefCountedPtr<soul::SourceCodeText> *)&local_b8);
          local_b8.parentScope = (Scope *)0x0;
          local_b8.location.sourceCode.object = (SourceCodeText *)0x0;
          local_b8.location.location.data = (char *)0x0;
          local_40.data = (char *)local_80->object;
          args_2 = createConnectionEndpoint
                             (allocator,&local_b8,
                              (pool_ptr<soul::AST::ProcessorInstance> *)&local_40,
                              (EndpointDeclaration *)*pp_Var7);
          RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                    ((RefCountedPtr<soul::SourceCodeText> *)&local_b8);
          local_b8.parentScope = (Scope *)0x0;
          local_84 = none;
          local_b8.location.sourceCode.object = (SourceCodeText *)0x0;
          local_b8.location.location.data = (char *)0x0;
          local_48.object = (SourceCodeText *)0x0;
          local_90.object =
               PoolAllocator::
               allocate<soul::AST::Connection,soul::AST::Context,soul::InterpolationType,soul::AST::Connection::SharedEndpoint&,soul::AST::Connection::SharedEndpoint&,decltype(nullptr)>
                         (&allocator->pool,&local_b8,&local_84,args_2,args_3,&local_48.object);
          std::
          vector<soul::pool_ref<soul::AST::Connection>,std::allocator<soul::pool_ref<soul::AST::Connection>>>
          ::emplace_back<soul::pool_ref<soul::AST::Connection>>(local_58,&local_90);
          RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                    ((RefCountedPtr<soul::SourceCodeText> *)&local_b8);
          bVar14 = true;
          SVar11._vptr_Scope = local_50._vptr_Scope;
        }
      }
    }
  }
  if (bVar14 != false) {
    ppVar1 = (local_98->processorInstances).
             super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar13 = (local_98->processorInstances).
                   super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar13 != ppVar1;
        ppVar13 = ppVar13 + 1) {
      pEVar5 = pool_ptr<soul::AST::Expression>::operator->(&ppVar13->object->targetProcessor);
      (*(pEVar5->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_b8,pEVar5);
      if (local_b8.location.sourceCode.object != (SourceCodeText *)0x0) {
        pPVar6 = pool_ptr<soul::AST::ProcessorBase>::operator->
                           ((pool_ptr<soul::AST::ProcessorBase> *)&local_b8);
        iVar4 = (*(pPVar6->super_ModuleBase).super_ASTObject._vptr_ASTObject[8])(pPVar6);
        for (plVar12 = (long *)CONCAT44(extraout_var_00,iVar4); plVar12 != extraout_RDX_00;
            plVar12 = plVar12 + 1) {
          *(undefined1 *)(*plVar12 + 0x60) = 0;
        }
      }
    }
  }
  return bVar14;
}

Assistant:

static bool exposeChildEndpoints (AST::Allocator& allocator, AST::Graph& graph)
    {
        bool anyChanges = false;

        for (auto& i : graph.processorInstances)
            if (auto childProcessor = i->targetProcessor->getAsProcessor())
                if (auto childGraph = cast<AST::Graph> (childProcessor))
                    if (exposeChildEndpoints (allocator, *childGraph))
                        anyChanges = true;

        for (auto& processorInstance : graph.processorInstances)
        {
            if (auto childProcessor = processorInstance->targetProcessor->getAsProcessor())
            {
                for (auto& childEndpoint : childProcessor->getEndpoints())
                {
                    if (childEndpoint->needsToBeExposedInParent)
                    {
                        auto parentEndpoint = graph.findEndpoint (childEndpoint->name, false);

                        if (parentEndpoint != nullptr)
                        {
                            for (auto& t : childEndpoint->getDetails().getResolvedDataTypes())
                                ensureEventEndpointSupportsType (allocator, *parentEndpoint, t);
                        }
                        else
                        {
                            parentEndpoint = allocator.allocate<AST::EndpointDeclaration> (AST::Context(), false);
                            parentEndpoint->name = allocator.get (childEndpoint->name);
                            parentEndpoint->details = allocator.allocate<AST::EndpointDetails> (childEndpoint->getDetails());
                            parentEndpoint->needsToBeExposedInParent = true;
                            graph.endpoints.push_back (*parentEndpoint);
                        }

                        auto& parent = allocator.allocate<AST::Connection::SharedEndpoint> (createEndpointRef (allocator, {}, *parentEndpoint));
                        auto& child = createConnectionEndpoint (allocator, {}, processorInstance, childEndpoint);

                        graph.connections.push_back (allocator.allocate<AST::Connection> (AST::Context(), InterpolationType::none,
                                                                                          child, parent, nullptr));
                        anyChanges = true;
                    }
                }
            }
        }

        if (anyChanges)
            for (auto& i : graph.processorInstances)
                if (auto childProcessor = i->targetProcessor->getAsProcessor())
                    for (auto& childEndpoint : childProcessor->getEndpoints())
                        childEndpoint->needsToBeExposedInParent = false;

        return anyChanges;
    }